

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

char * __thiscall spvc_context_s::allocate_name(spvc_context_s *this,string *name)

{
  pointer pcVar1;
  char *pcVar2;
  size_t sVar3;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var4;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  
  _Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x28);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + name->_M_string_length);
  *(undefined ***)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__StringAllocation_0049da98;
  *(undefined8 **)
   ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18);
  if (local_60 == &local_50) {
    *(undefined8 *)
     ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) =
         local_50;
    *(undefined8 *)
     ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) =
         uStack_48;
  }
  else {
    *(undefined8 **)
     ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
         local_60;
    *(undefined8 *)
     ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) =
         local_50;
  }
  *(undefined8 *)
   ((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) =
       local_58;
  pcVar2 = *(char **)((long)_Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>.
                            _M_head_impl + 8);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&this->allocations,
            (this->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar3 = (this->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (this->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar3]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var4.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (this->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar3 + 1;
  return pcVar2;
}

Assistant:

const char *spvc_context_s::allocate_name(const std::string &name)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto alloc = spvc_allocate<StringAllocation>(name);
		auto *ret = alloc->str.c_str();
		allocations.emplace_back(std::move(alloc));
		return ret;
	}